

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::TransformLocalToParent
          (ChFrameMoving<double> *this,ChFrameMoving<double> *local,ChFrameMoving<double> *parent)

{
  ChCoordsys<double> *localpos;
  ChQuaternion<double> *other;
  ChQuaternion<double> *this_00;
  ChQuaternion<double> *other_00;
  ChQuaternion<double> local_d8;
  ChQuaternion<double> *local_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  ChFrame<double>::TransformLocalToParent
            (&this->super_ChFrame<double>,&local->super_ChFrame<double>,
             &parent->super_ChFrame<double>);
  localpos = &(local->super_ChFrame<double>).coord;
  PointSpeedLocalToParent((ChVector<double> *)&local_d8,this,&localpos->pos,&(local->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_d8 != &parent->coord_dt) {
    (parent->coord_dt).pos.m_data[0] = local_d8.m_data[0];
    (parent->coord_dt).pos.m_data[1] = local_d8.m_data[1];
    (parent->coord_dt).pos.m_data[2] = local_d8.m_data[2];
  }
  PointAccelerationLocalToParent
            ((ChVector<double> *)&local_d8,this,&localpos->pos,&(local->coord_dt).pos,
             &(local->coord_dtdt).pos);
  if ((ChCoordsys<double> *)&local_d8 != &parent->coord_dtdt) {
    (parent->coord_dtdt).pos.m_data[0] = local_d8.m_data[0];
    (parent->coord_dtdt).pos.m_data[1] = local_d8.m_data[1];
    (parent->coord_dtdt).pos.m_data[2] = local_d8.m_data[2];
  }
  other = &(local->super_ChFrame<double>).coord.rot;
  local_b8 = &(this->coord_dt).rot;
  ChQuaternion<double>::operator%(&local_70,local_b8,other);
  this_00 = &(this->super_ChFrame<double>).coord.rot;
  other_00 = &(local->coord_dt).rot;
  ChQuaternion<double>::operator%(&local_90,this_00,other_00);
  local_d8.m_data[0] = local_70.m_data[0] + local_90.m_data[0];
  local_d8.m_data[1] = local_70.m_data[1] + local_90.m_data[1];
  local_d8.m_data[2] = local_70.m_data[2] + local_90.m_data[2];
  local_d8.m_data[3] = local_70.m_data[3] + local_90.m_data[3];
  ChQuaternion<double>::operator=(&(parent->coord_dt).rot,&local_d8);
  ChQuaternion<double>::operator%(&local_70,&(this->coord_dtdt).rot,other);
  ChQuaternion<double>::operator%(&local_90,local_b8,other_00);
  local_b8 = (ChQuaternion<double> *)(local_90.m_data[0] + local_90.m_data[0] + local_70.m_data[0]);
  dStack_b0 = local_90.m_data[1] + local_90.m_data[1] + local_70.m_data[1];
  dStack_a8 = local_90.m_data[2] + local_90.m_data[2] + local_70.m_data[2];
  dStack_a0 = local_90.m_data[3] + local_90.m_data[3] + local_70.m_data[3];
  ChQuaternion<double>::operator%(&local_50,this_00,&(local->coord_dtdt).rot);
  local_d8.m_data[0] = (double)local_b8 + local_50.m_data[0];
  local_d8.m_data[1] = dStack_b0 + local_50.m_data[1];
  local_d8.m_data[2] = dStack_a8 + local_50.m_data[2];
  local_d8.m_data[3] = dStack_a0 + local_50.m_data[3];
  ChQuaternion<double>::operator=(&(parent->coord_dtdt).rot,&local_d8);
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrameMoving<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrameMoving<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformLocalToParent(local, parent);

        // pos_dt
        parent.coord_dt.pos = PointSpeedLocalToParent(local.coord.pos, local.coord_dt.pos);

        // pos_dtdt
        parent.coord_dtdt.pos =
            PointAccelerationLocalToParent(local.coord.pos, local.coord_dt.pos, local.coord_dtdt.pos);

        // rot_dt
        parent.coord_dt.rot = coord_dt.rot % local.coord.rot + this->coord.rot % local.coord_dt.rot;

        // rot_dtdt
        parent.coord_dtdt.rot = coord_dtdt.rot % local.coord.rot + (coord_dt.rot % local.coord_dt.rot) * 2 +
                                this->coord.rot % local.coord_dtdt.rot;
    }